

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gms_matcher.h
# Opt level: O1

void __thiscall
gms_matcher::NormalizePoints
          (gms_matcher *this,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *kp,Size *size,
          vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *npts)

{
  int iVar1;
  int iVar2;
  pointer pKVar3;
  pointer pPVar4;
  pointer pKVar5;
  long lVar6;
  size_type __new_size;
  
  pKVar5 = (kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar3 = (kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = ((long)pKVar5 - (long)pKVar3 >> 2) * 0x6db6db6db6db6db7;
  iVar1 = size->width;
  iVar2 = size->height;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::resize(npts,__new_size);
  if (pKVar5 != pKVar3) {
    pPVar4 = (npts->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pKVar5 = (kp->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
             super__Vector_impl_data._M_start + 4;
    lVar6 = 0;
    do {
      pPVar4[lVar6].x = *(float *)(pKVar5 + -4) / (float)iVar1;
      pPVar4[lVar6].y = *(float *)pKVar5 / (float)iVar2;
      lVar6 = lVar6 + 1;
      pKVar5 = pKVar5 + 0x1c;
    } while (__new_size + (__new_size == 0) != lVar6);
  }
  return;
}

Assistant:

void NormalizePoints(const vector<KeyPoint> &kp, const Size &size, vector<Point2f> &npts) {
		const size_t numP = kp.size();
		const int width   = size.width;
		const int height  = size.height;
		npts.resize(numP);

		for (size_t i = 0; i < numP; i++)
		{
			npts[i].x = kp[i].pt.x / width;
			npts[i].y = kp[i].pt.y / height;
		}
	}